

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transformer.cpp
# Opt level: O2

unique_ptr<verilogAST::BinaryOp,_std::default_delete<verilogAST::BinaryOp>_> __thiscall
verilogAST::Transformer::visit
          (Transformer *this,
          unique_ptr<verilogAST::BinaryOp,_std::default_delete<verilogAST::BinaryOp>_> *node)

{
  long *plVar1;
  long *plVar2;
  long *in_RDX;
  long *local_30;
  long *local_28;
  long *local_20;
  
  local_28 = *(long **)(*in_RDX + 8);
  *(undefined8 *)(*in_RDX + 8) = 0;
  (*(code *)(((node->_M_t).
              super___uniq_ptr_impl<verilogAST::BinaryOp,_std::default_delete<verilogAST::BinaryOp>_>
              ._M_t.
              super__Tuple_impl<0UL,_verilogAST::BinaryOp_*,_std::default_delete<verilogAST::BinaryOp>_>
              .super__Head_base<0UL,_verilogAST::BinaryOp_*,_false>._M_head_impl)->super_Expression)
            .super_Node)(&local_30);
  plVar2 = local_30;
  local_30 = (long *)0x0;
  plVar1 = *(long **)(*in_RDX + 8);
  *(long **)(*in_RDX + 8) = plVar2;
  if (plVar1 != (long *)0x0) {
    (**(code **)(*plVar1 + 0x10))();
    if (local_30 != (long *)0x0) {
      (**(code **)(*local_30 + 0x10))();
    }
  }
  local_30 = (long *)0x0;
  if (local_28 != (long *)0x0) {
    (**(code **)(*local_28 + 0x10))();
  }
  local_28 = (long *)0x0;
  local_20 = *(long **)(*in_RDX + 0x18);
  *(undefined8 *)(*in_RDX + 0x18) = 0;
  (*(code *)(((node->_M_t).
              super___uniq_ptr_impl<verilogAST::BinaryOp,_std::default_delete<verilogAST::BinaryOp>_>
              ._M_t.
              super__Tuple_impl<0UL,_verilogAST::BinaryOp_*,_std::default_delete<verilogAST::BinaryOp>_>
              .super__Head_base<0UL,_verilogAST::BinaryOp_*,_false>._M_head_impl)->super_Expression)
            .super_Node)(&local_30,node);
  plVar2 = local_30;
  local_30 = (long *)0x0;
  plVar1 = *(long **)(*in_RDX + 0x18);
  *(long **)(*in_RDX + 0x18) = plVar2;
  if (plVar1 != (long *)0x0) {
    (**(code **)(*plVar1 + 0x10))();
    if (local_30 != (long *)0x0) {
      (**(code **)(*local_30 + 0x10))();
    }
  }
  local_30 = (long *)0x0;
  if (local_20 != (long *)0x0) {
    (**(code **)(*local_20 + 0x10))();
  }
  this->_vptr_Transformer = (_func_int **)*in_RDX;
  *in_RDX = 0;
  return (__uniq_ptr_data<verilogAST::BinaryOp,_std::default_delete<verilogAST::BinaryOp>,_true,_true>
          )(__uniq_ptr_data<verilogAST::BinaryOp,_std::default_delete<verilogAST::BinaryOp>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<BinaryOp> Transformer::visit(std::unique_ptr<BinaryOp> node) {
  node->left = this->visit(std::move(node->left));
  node->right = this->visit(std::move(node->right));
  return node;
}